

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

bool Catch::
     compareEqual<std::vector<char,std::allocator<char>>,std::vector<char,std::allocator<char>>>
               (vector<char,_std::allocator<char>_> *lhs,vector<char,_std::allocator<char>_> *rhs)

{
  bool bVar1;
  
  bVar1 = std::operator==(lhs,rhs);
  return bVar1;
}

Assistant:

auto compareEqual( LhsT const& lhs, RhsT const& rhs ) -> bool { return static_cast<bool>(lhs == rhs); }